

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writesrc.cpp
# Opt level: O1

FILE * usrc_createWithHeader(char *path,char *filename,char *header,char *generator)

{
  size_t sVar1;
  FILE *pFVar2;
  tm *__tp;
  char *pcVar3;
  char *__dest;
  FILE *__stream;
  time_t t;
  char buffer [1024];
  undefined8 local_430;
  char local_428 [1024];
  
  pcVar3 = filename;
  if (path != (char *)0x0) {
    pcVar3 = local_428;
    strcpy(pcVar3,path);
    sVar1 = strlen(pcVar3);
    __dest = local_428 + sVar1;
    if ((0 < (long)sVar1) && (local_428[sVar1 - 1] != '/')) {
      *__dest = '/';
      __dest = local_428 + sVar1 + 1;
    }
    strcpy(__dest,filename);
  }
  pFVar2 = fopen(pcVar3,"w");
  if (pFVar2 == (FILE *)0x0) {
    pcVar3 = "";
    if (path != (char *)0x0) {
      pcVar3 = path;
    }
    header = "usrc_create(%s, %s): unable to create file\n";
    generator = filename;
    filename = pcVar3;
    __stream = _stderr;
  }
  else {
    time(&local_430);
    __tp = localtime(&local_430);
    __stream = pFVar2;
    if (generator == (char *)0x0) {
      generator = local_428;
      strftime(generator,0x400,"%Y-%m-%d",__tp);
    }
  }
  fprintf(__stream,header,filename,generator);
  return (FILE *)pFVar2;
}

Assistant:

static FILE *
usrc_createWithHeader(const char *path, const char *filename,
                      const char *header, const char *generator) {
    char buffer[1024];
    const char *p;
    char *q;
    FILE *f;
    char c;

    if(path==NULL) {
        p=filename;
    } else {
        /* concatenate path and filename, with U_FILE_SEP_CHAR in between if necessary */
        uprv_strcpy(buffer, path);
        q=buffer+uprv_strlen(buffer);
        if(q>buffer && (c=*(q-1))!=U_FILE_SEP_CHAR && c!=U_FILE_ALT_SEP_CHAR) {
            *q++=U_FILE_SEP_CHAR;
        }
        uprv_strcpy(q, filename);
        p=buffer;
    }

    f=fopen(p, "w");
    if(f!=NULL) {
        const struct tm *lt;
        time_t t;

        time(&t);
        lt=localtime(&t);
        if(generator==NULL) {
            strftime(buffer, sizeof(buffer), "%Y-%m-%d", lt);
            fprintf(f, header, filename, buffer);
        } else {
            fprintf(f, header, filename, generator);
        }
    } else {
        fprintf(
            stderr,
            "usrc_create(%s, %s): unable to create file\n",
            path!=NULL ? path : "", filename);
    }
    return f;
}